

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

void Nwk_ManSupportNodes_rec(Nwk_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = pNode->pMan->nTravIds;
  if (pNode->TravId != iVar1) {
    pNode->TravId = iVar1;
    uVar2 = *(uint *)&pNode->field_0x20 & 7;
    if (uVar2 == 1) {
      Vec_PtrPush(vNodes,pNode);
      return;
    }
    if (uVar2 != 3) {
      __assert_fail("Nwk_ObjIsNode( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                    ,0x1ed,"void Nwk_ManSupportNodes_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
    }
    for (lVar3 = 0; (lVar3 < pNode->nFanins && (pNode->pFanio[lVar3] != (Nwk_Obj_t *)0x0));
        lVar3 = lVar3 + 1) {
      Nwk_ManSupportNodes_rec(pNode->pFanio[lVar3],vNodes);
    }
  }
  return;
}

Assistant:

void Nwk_ManSupportNodes_rec( Nwk_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Nwk_ObjIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Nwk_ObjSetTravIdCurrent( pNode );
    // collect the CI
    if ( Nwk_ObjIsCi(pNode) )
    {
        Vec_PtrPush( vNodes, pNode );
        return;
    }
    assert( Nwk_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    Nwk_ObjForEachFanin( pNode, pFanin, i )
        Nwk_ManSupportNodes_rec( pFanin, vNodes );
}